

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::DeepScanLineInputFile::Data::LineBufferTask::~LineBufferTask(LineBufferTask *this)

{
  LineBufferTask *in_RDI;
  
  ~LineBufferTask(in_RDI);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

~LineBufferTask () override
        {
            _line_group->push (_line);
        }